

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O1

void __thiscall YsSoundPlayer::APISpecificData::DiscardEnded(APISpecificData *this)

{
  pointer pPVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  
  uVar4 = (long)(this->playing).
                super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->playing).
                super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (long)uVar4) {
    uVar4 = uVar4 / 0x18;
    lVar6 = uVar4 + 1;
    lVar2 = uVar4 * 0x18;
    do {
      pPVar1 = (this->playing).
               super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&pPVar1[-1].dat + lVar2) == 0) {
        puVar5 = (undefined8 *)((long)&pPVar1[-1].dat + lVar2);
        pPVar1 = (this->playing).
                 super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar5[2] = *(undefined8 *)&pPVar1[-1].stop;
        uVar3 = *(undefined8 *)&pPVar1[-1].ptr;
        *puVar5 = pPVar1[-1].dat;
        puVar5[1] = uVar3;
        std::
        vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
        ::resize(&this->playing,
                 ((long)(this->playing).
                        super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->playing).
                        super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1);
      }
      lVar6 = lVar6 + -1;
      lVar2 = lVar2 + -0x18;
    } while (1 < lVar6);
  }
  if ((this->playing).
      super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->playing).
      super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    return;
  }
  snd_pcm_drop(this->handle);
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::DiscardEnded(void)
{
	for(long long int i=playing.size()-1; 0<=i; --i)
	{
		if(nullptr==playing[i].dat)
		{
			playing[i]=playing.back();
			playing.resize(playing.size()-1);
		}
	}

	if(0==playing.size())
	{
		snd_pcm_drop(handle);
	}
}